

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O2

int mg_strncasecmp(char *s1,char *s2,size_t len)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  
  if (len != 0) {
    lVar3 = len - 1;
    do {
      iVar1 = lowercase(s1);
      iVar2 = lowercase(s2);
      if (iVar1 - iVar2 != 0) {
        return iVar1 - iVar2;
      }
      bVar4 = lVar3 != 0;
      lVar3 = lVar3 + -1;
      if (*s1 == '\0') {
        return 0;
      }
      s2 = s2 + 1;
      s1 = s1 + 1;
    } while (bVar4);
  }
  return 0;
}

Assistant:

CIVETWEB_API int
mg_strncasecmp(const char *s1, const char *s2, size_t len)
{
	int diff = 0;

	if (len > 0) {
		do {
			diff = lowercase(s1++) - lowercase(s2++);
		} while (diff == 0 && s1[-1] != '\0' && --len > 0);
	}

	return diff;
}